

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_base64.c
# Opt level: O2

void * uo_base64url_decode(void *dst,char *src,size_t src_len)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  char *pcVar6;
  byte *pbVar7;
  
  pcVar1 = src + src_len;
  pbVar7 = (byte *)((long)dst + 1);
  for (pcVar6 = src + 4; pcVar6 <= pcVar1; pcVar6 = pcVar6 + 4) {
    bVar2 = atob_url[(byte)pcVar6[-3]];
    bVar3 = atob_url[(byte)pcVar6[-2]];
    bVar4 = pcVar6[-1];
    pbVar7[-1] = bVar2 >> 4 | atob_url[(byte)pcVar6[-4]] << 2;
    *pbVar7 = bVar3 >> 2 | bVar2 << 4;
    pbVar7[1] = bVar3 << 6 | atob_url[bVar4];
    src_len = src_len - 4;
    pbVar7 = pbVar7 + 3;
  }
  if (src_len == 2) {
    pbVar7[-1] = atob_url[(byte)pcVar6[-3]] >> 4 | atob_url[(byte)pcVar6[-4]] << 2;
    pbVar5 = pbVar7;
  }
  else {
    pbVar5 = pbVar7 + -1;
    if (src_len == 3) {
      bVar2 = atob_url[(byte)pcVar6[-3]];
      bVar3 = atob_url[(byte)pcVar6[-2]];
      pbVar7[-1] = bVar2 >> 4 | atob_url[(byte)pcVar6[-4]] << 2;
      *pbVar7 = bVar3 >> 2 | bVar2 << 4;
      pbVar5 = pbVar7 + 1;
    }
  }
  return pbVar5;
}

Assistant:

void *uo_base64url_decode(
    void *dst,
    const char *src,
    size_t src_len)
{
    unsigned char *b = (unsigned char *)dst;
    const unsigned char *a = (unsigned char *)src;
    const unsigned char *end = a + src_len;
    unsigned char a0, a1, a2, a3;

    while (a + 4 <= end)
    {
        a0 = atob_url[*a++];
        a1 = atob_url[*a++];
        a2 = atob_url[*a++];
        a3 = atob_url[*a++];

        *b++ = a0 << 2 | a1 >> 4;
        *b++ = (a1 & 0x0F) << 4 | a2 >> 2;
        *b++ = (a2 & 0x03) << 6 | a3;
    }

    switch (end - a)
    {
        case 3:
            a0 = atob_url[*a++];
            a1 = atob_url[*a++];
            a2 = atob_url[*a++];

            *b++ = a0 << 2 | a1 >> 4;
            *b++ = (a1 & 0x0F) << 4 | a2 >> 2;
            break;

        case 2:
            a0 = atob_url[*a++];
            a1 = atob_url[*a++];

            *b++ = a0 << 2 | a1 >> 4;
            break;
    }

    return b;
}